

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_MapDirectory_Test::TestBody
          (DiskSourceTreeTest_MapDirectory_Test *this)

{
  char *pcVar1;
  pointer pbVar2;
  char *contents;
  string_view virtual_path;
  string_view disk_path;
  string *local_98;
  AlphaNum *local_90;
  string local_88;
  AlphaNum local_68;
  _func_int **local_38;
  SourceTree local_28;
  
  pbVar2 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (AlphaNum *)(pbVar2->_M_dataplus)._M_p;
  local_98 = (string *)pbVar2->_M_string_length;
  local_68.piece_._M_len = 4;
  local_68.piece_._M_str = "/foo";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)&stack0xffffffffffffffc8,(lts_20250127 *)&local_98,&local_68,local_90);
  DiskSourceTreeTest::AddFile
            ((DiskSourceTreeTest *)&stack0xffffffffffffffc8,(string *)"Hello World!",contents);
  if ((SourceTree *)local_38 != &stack0xffffffffffffffd8) {
    operator_delete(local_38,(long)local_28._vptr_SourceTree + 1);
  }
  pbVar2 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  virtual_path._M_str = "baz";
  virtual_path._M_len = 3;
  disk_path._M_str = (pbVar2->_M_dataplus)._M_p;
  disk_path._M_len = pbVar2->_M_string_length;
  DiskSourceTree::MapPath(&(this->super_DiskSourceTreeTest).source_tree_,virtual_path,disk_path);
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz/foo","");
  DiskSourceTreeTest::ExpectFileContents(&this->super_DiskSourceTreeTest,local_98,(char *)local_90);
  if (local_98 != &local_88) {
    operator_delete(local_98,(ulong)(local_88._M_dataplus._M_p + 1));
  }
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz/bar","");
  pcVar1 = local_68.digits_;
  local_68.piece_._M_len = (size_t)pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"File not found.","");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,local_98,(string *)local_90);
  if ((char *)local_68.piece_._M_len != pcVar1) {
    operator_delete((void *)local_68.piece_._M_len,local_68.digits_._0_8_ + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,(ulong)(local_88._M_dataplus._M_p + 1));
  }
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"foo","");
  local_68.piece_._M_len = (size_t)pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"File not found.","");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,local_98,(string *)local_90);
  if ((char *)local_68.piece_._M_len != pcVar1) {
    operator_delete((void *)local_68.piece_._M_len,local_68.digits_._0_8_ + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,(ulong)(local_88._M_dataplus._M_p + 1));
  }
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"bar","");
  local_68.piece_._M_len = (size_t)pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"File not found.","");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,local_98,(string *)local_90);
  if ((char *)local_68.piece_._M_len != pcVar1) {
    operator_delete((void *)local_68.piece_._M_len,local_68.digits_._0_8_ + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,(ulong)(local_88._M_dataplus._M_p + 1));
  }
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz//foo","");
  local_68.piece_._M_len = (size_t)pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,"");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,local_98,(string *)local_90);
  if ((char *)local_68.piece_._M_len != pcVar1) {
    operator_delete((void *)local_68.piece_._M_len,local_68.digits_._0_8_ + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,(ulong)(local_88._M_dataplus._M_p + 1));
  }
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz/../baz/foo","");
  local_68.piece_._M_len = (size_t)pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,"");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,local_98,(string *)local_90);
  if ((char *)local_68.piece_._M_len != pcVar1) {
    operator_delete((void *)local_68.piece_._M_len,local_68.digits_._0_8_ + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,(ulong)(local_88._M_dataplus._M_p + 1));
  }
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz/./foo","");
  local_68.piece_._M_len = (size_t)pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,"");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,local_98,(string *)local_90);
  if ((char *)local_68.piece_._M_len != pcVar1) {
    operator_delete((void *)local_68.piece_._M_len,local_68.digits_._0_8_ + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,(ulong)(local_88._M_dataplus._M_p + 1));
  }
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"baz/foo/","");
  local_68.piece_._M_len = (size_t)pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"File not found.","");
  DiskSourceTreeTest::ExpectCannotOpenFile
            (&this->super_DiskSourceTreeTest,local_98,(string *)local_90);
  if ((char *)local_68.piece_._M_len != pcVar1) {
    operator_delete((void *)local_68.piece_._M_len,local_68.digits_._0_8_ + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,(ulong)(local_88._M_dataplus._M_p + 1));
  }
  return;
}

Assistant:

TEST_F(DiskSourceTreeTest, MapDirectory) {
  // Test opening a file in a directory that is mapped to somewhere other
  // than the root of the source tree.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  source_tree_.MapPath("baz", dirnames_[0]);

  ExpectFileContents("baz/foo", "Hello World!");
  ExpectCannotOpenFile("baz/bar", "File not found.");
  ExpectCannotOpenFile("foo", "File not found.");
  ExpectCannotOpenFile("bar", "File not found.");

  // Non-canonical file names should not work.
  ExpectCannotOpenFile("baz//foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/../baz/foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/./foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/foo/", "File not found.");
}